

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O1

void __thiscall
t_haxe_generator::generate_haxe_validator(t_haxe_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *field;
  t_type *ptVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  pointer pptVar8;
  string local_90;
  string local_70;
  string local_50;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"public function validate() : Void {",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"// check for required fields",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar8 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if ((*pptVar8)->req_ == T_REQUIRED) {
        bVar3 = type_can_be_null(this,(*pptVar8)->type_);
        poVar5 = t_generator::indent((t_generator *)this,out);
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (",4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar8)->name_)._M_dataplus._M_p,
                              ((*pptVar8)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," == null) {",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          poVar5 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,
                     "  throw new TProtocolException(TProtocolException.UNKNOWN, \"Required field \'"
                     ,0x4c);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar8)->name_)._M_dataplus._M_p,
                              ((*pptVar8)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"\' was not present! Struct: \" + toString());",0x2b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          poVar5 = t_generator::indent((t_generator *)this,out);
          lVar6 = 1;
          pcVar7 = "}";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"// alas, we cannot check \'",0x1a);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar8)->name_)._M_dataplus._M_p,
                              ((*pptVar8)->name_)._M_string_length);
          lVar6 = 0x1b;
          pcVar7 = "\' because it\'s a primitive.";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,lVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"// check that fields of type enum have valid values",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  for (pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar8 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
    field = *pptVar8;
    ptVar2 = field->type_;
    iVar4 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])(ptVar2);
    if ((char)iVar4 != '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (",4);
      generate_isset_check_abi_cxx11_(&local_90,this,field);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," && !",5);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1f])
                (&local_50,this,ptVar2);
      get_cap_name(&local_70,this,&local_50);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,".VALID_VALUES.contains(",0x17);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(field->name_)._M_dataplus._M_p,(field->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")){",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"throw new TProtocolException(TProtocolException.UNKNOWN, \"The field \'",
                 0x45);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(field->name_)._M_dataplus._M_p,(field->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"\' has been assigned the invalid value \" + ",0x2a);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(field->name_)._M_dataplus._M_p,(field->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_haxe_generator::generate_haxe_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "public function validate() : Void {" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << indent() << "// check for required fields" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      if (type_can_be_null((*f_iter)->get_type())) {
        indent(out) << "if (" << (*f_iter)->get_name() << " == null) {" << endl;
        indent(out)
            << "  throw new TProtocolException(TProtocolException.UNKNOWN, \"Required field '"
            << (*f_iter)->get_name() << "' was not present! Struct: \" + toString());" << endl;
        indent(out) << "}" << endl;
      } else {
        indent(out) << "// alas, we cannot check '" << (*f_iter)->get_name()
                    << "' because it's a primitive." << endl;
      }
    }
  }

  // check that fields of type enum have valid values
  out << indent() << "// check that fields of type enum have valid values" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);
    t_type* type = field->get_type();
    // if field is an enum, check that its value is valid
    if (type->is_enum()) {
      indent(out) << "if (" << generate_isset_check(field) << " && !"
                  << get_cap_name(get_enum_class_name(type)) << ".VALID_VALUES.contains("
                  << field->get_name() << ")){" << endl;
      indent_up();
      indent(out) << "throw new TProtocolException(TProtocolException.UNKNOWN, \"The field '"
                  << field->get_name() << "' has been assigned the invalid value \" + "
                  << field->get_name() << ");" << endl;
      indent_down();
      indent(out) << "}" << endl;
    }
  }

  indent_down();
  indent(out) << "}" << endl << endl;
}